

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall Shader::fragment(Shader *this,Model *model,vec3f bar,TGAColor *color)

{
  int i;
  TGAColor TVar1;
  vec<3UL,_double> *pvVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  undefined4 uVar9;
  double ret_3;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  vec<3UL,_double> ret;
  vec4f sb_p;
  vec3f l;
  vec<3UL,_double> ret_12;
  vec3f n;
  vec2f uv;
  double local_120;
  vec<3UL,_double> local_118;
  double adStack_100 [3];
  vec<3UL,_double> local_e8;
  double adStack_d0 [5];
  undefined1 local_a8 [16];
  vec<3UL,_double> local_98;
  vec3f local_78;
  vec<3UL,_double> local_58;
  vec2f local_40;
  
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  local_e8.z = 0.0;
  lVar6 = 0;
  do {
    dVar12 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_tri).rows[2].x + lVar6),&bar
                            );
    lVar4 = 0;
    if (lVar6 != -0x30) {
      lVar4 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(double *)((long)&local_e8.x + lVar4) = dVar12;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  local_118.z = 0.0;
  adStack_100[0] = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  sVar7 = 3;
  do {
    uVar10 = 0x3ff00000;
    uVar9 = 0;
    if (sVar7 + 1 < 4) {
      dVar12 = vec<3UL,_double>::operator[](&local_e8,sVar7);
      uVar9 = SUB84(dVar12,0);
      uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
    }
    (&local_118.x)[sVar7] = (double)CONCAT44(uVar10,uVar9);
    bVar8 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar8);
  adStack_d0[3] = 0.0;
  adStack_d0[4] = 0.0;
  adStack_d0[1] = 0.0;
  adStack_d0[2] = 0.0;
  pdVar3 = (this->uniform_Mshadow).rows[3].data + 3;
  lVar6 = 4;
  do {
    lVar4 = lVar6 + -1;
    dVar12 = 0.0;
    lVar5 = 0;
    do {
      dVar12 = dVar12 + pdVar3[lVar5] * adStack_100[lVar5];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    adStack_d0[lVar6] = dVar12;
    pdVar3 = pdVar3 + -4;
    lVar6 = lVar4;
  } while (lVar4 != 0);
  local_118.z = adStack_d0[3];
  adStack_100[0] = adStack_d0[4];
  local_118.x = adStack_d0[1];
  local_118.y = adStack_d0[2];
  lVar6 = 3;
  do {
    (&local_118.x)[lVar6] = (&local_118.x)[lVar6] / adStack_d0[4];
    bVar8 = lVar6 != 0;
    lVar6 = lVar6 + -1;
  } while (bVar8);
  adStack_d0[3] = local_118.z;
  adStack_d0[4] = adStack_100[0];
  adStack_d0[1] = local_118.x;
  adStack_d0[2] = local_118.y;
  dVar12 = DepthBuffer::get(this->shadow_buffer,(long)(int)local_118.x,(long)(int)local_118.y);
  local_a8 = ZEXT416((uint)(-(ulong)(dVar12 <= adStack_d0[3] + 43.34) >> 0x20) & 0x3ff00000) << 0x20
  ;
  local_120 = 0.0;
  lVar6 = 0;
  adStack_100[2] = 0.0;
  do {
    dVar12 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_uv).rows[1].x + lVar6),&bar)
    ;
    if (lVar6 != -0x18) {
      local_120 = dVar12;
      dVar12 = adStack_100[2];
    }
    adStack_100[2] = dVar12;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x30);
  local_40.x = adStack_100[2];
  local_40.y = local_120;
  Model::normal(&local_78,model,&local_40);
  pvVar2 = vec<3UL,_double>::normalize(&local_78);
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  local_e8.z = 0.0;
  adStack_d0[0] = 0.0;
  sVar7 = 3;
  do {
    uVar10 = 0x3ff00000;
    uVar9 = 0;
    if (sVar7 + 1 < 4) {
      dVar12 = vec<3UL,_double>::operator[](pvVar2,sVar7);
      uVar9 = SUB84(dVar12,0);
      uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
    }
    (&local_e8.x)[sVar7] = (double)CONCAT44(uVar10,uVar9);
    bVar8 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar8);
  local_118.z = 0.0;
  adStack_100[0] = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  pdVar3 = (this->uniform_MIT).rows[3].data + 3;
  lVar6 = 4;
  do {
    lVar6 = lVar6 + -1;
    dVar12 = 0.0;
    lVar4 = 0;
    do {
      dVar12 = dVar12 + pdVar3[lVar4] * adStack_d0[lVar4];
      lVar4 = lVar4 + -1;
    } while (lVar4 != -4);
    *(double *)((long)&local_118 + lVar6 * 8) = dVar12;
    pdVar3 = pdVar3 + -4;
  } while (lVar6 != 0);
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.z = 0.0;
  lVar6 = 3;
  do {
    lVar4 = (ulong)(lVar6 != 2) * 8 + 8;
    if (lVar6 == 1) {
      lVar4 = 0;
    }
    *(double *)((long)&local_98.x + lVar4) = (&local_120)[lVar6];
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  pvVar2 = vec<3UL,_double>::normalize(&local_98);
  local_58.x = pvVar2->x;
  local_58.y = pvVar2->y;
  local_58.z = pvVar2->z;
  local_e8.z = 0.0;
  adStack_d0[0] = 0.0;
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  sVar7 = 3;
  do {
    uVar10 = 0x3ff00000;
    uVar9 = 0;
    if (sVar7 + 1 < 4) {
      dVar12 = vec<3UL,_double>::operator[](&light_dir,sVar7);
      uVar9 = SUB84(dVar12,0);
      uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
    }
    (&local_e8.x)[sVar7] = (double)CONCAT44(uVar10,uVar9);
    bVar8 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar8);
  local_118.z = 0.0;
  adStack_100[0] = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  pdVar3 = (this->uniform_M).rows[3].data + 3;
  lVar6 = 4;
  do {
    lVar6 = lVar6 + -1;
    dVar12 = 0.0;
    lVar4 = 0;
    do {
      dVar12 = dVar12 + pdVar3[lVar4] * adStack_d0[lVar4];
      lVar4 = lVar4 + -1;
    } while (lVar4 != -4);
    *(double *)((long)&local_118 + lVar6 * 8) = dVar12;
    pdVar3 = pdVar3 + -4;
  } while (lVar6 != 0);
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 0.0;
  lVar6 = 3;
  do {
    lVar4 = (ulong)(lVar6 != 2) * 8 + 8;
    if (lVar6 == 1) {
      lVar4 = 0;
    }
    *(double *)((long)&local_78.x + lVar4) = (&local_120)[lVar6];
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  pvVar2 = vec<3UL,_double>::normalize(&local_78);
  local_98.x = pvVar2->x;
  local_98.y = pvVar2->y;
  local_98.z = pvVar2->z;
  dVar12 = dot<3ul,double>(&local_58,&local_98);
  local_e8.x = local_58.x;
  local_e8.y = local_58.y;
  local_e8.z = local_58.z;
  lVar6 = -1;
  do {
    lVar4 = (ulong)(lVar6 != 0) * 8 + 8;
    if (lVar6 == 1) {
      lVar4 = 0;
    }
    *(double *)((long)&local_e8.x + lVar4) =
         *(double *)((long)&local_e8.x + lVar4) * (dVar12 + dVar12);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  uVar9 = local_a8._12_4_;
  local_a8._8_4_ = local_a8._8_4_;
  local_a8._0_8_ = local_a8._0_8_ * 0.7 + 0.3;
  local_a8._12_4_ = uVar9;
  operator-(&local_118,&local_e8,&local_98);
  pvVar2 = vec<3UL,_double>::normalize(&local_118);
  uVar9 = 0;
  uVar10 = 0;
  dVar12 = pvVar2->z;
  if (0.0 <= dVar12) {
    uVar9 = SUB84(dVar12,0);
    uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
  }
  local_120 = (double)CONCAT44(uVar10,uVar9);
  dVar12 = Model::specular(model,&local_40);
  local_120 = pow(local_120,dVar12);
  dVar12 = dot<3ul,double>(&local_58,&local_98);
  uVar9 = SUB84(dVar12,0);
  uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
  if (dVar12 <= 0.0) {
    uVar9 = 0;
    uVar10 = 0;
  }
  adStack_100[2] = (double)CONCAT44(uVar10,uVar9);
  TVar1 = Model::diffuse(model,&local_40);
  local_118.x = (double)CONCAT35(local_118.x._5_3_,TVar1);
  lVar6 = 0;
  do {
    dVar11 = (double)*(byte *)((long)&local_118.x + lVar6) * (double)local_a8._0_8_ *
             (adStack_100[2] * 1.2 + local_120 * 0.6) + 20.0;
    dVar12 = 255.0;
    if (dVar11 <= 255.0) {
      dVar12 = dVar11;
    }
    color->bgra[lVar6] = (uint8_t)(int)dVar12;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec4f sb_p = uniform_Mshadow *
                     embed<4>(varying_tri * bar);  // corresponding point in the shadow buffer
        sb_p = sb_p / sb_p[3];
        double shadow = .3 + .7 * (shadow_buffer.get(int(sb_p[0]), int(sb_p[1])) <=
                                   sb_p[2] + 43.34);  // magic coeff to avoid z-fighting
        // shadow = std::max(0., shadow);

        // shadow = .7 * shadow_buffer.get(int(sb_p[0]), int(sb_p[1]));
        vec2f uv = varying_uv * bar;  // interpolate uv for the current pixel
        vec3f n =
            proj<3>(uniform_MIT * embed<4>(model.normal(uv).normalize())).normalize();  // normal
        vec3f l = proj<3>(uniform_M * embed<4>(light_dir)).normalize();  // light vector
        vec3f r = (n * (dot(n, l) * 2.) - l).normalize();                // reflected light
        double spec = std::pow(std::max(r.z, 0.0), model.specular(uv));
        double diff = std::max(0., dot(n, l));
        TGAColor c = model.diffuse(uv);
        for (int i = 0; i < 3; i++) {
            color[i] =
                static_cast<uint8_t>(std::min(20 + c[i] * shadow * (1.2 * diff + .6 * spec), 255.));
            // color[i] = (uint8_t)(model.specular(uv) + 64);
        }

        return false;
    }